

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallThatHappened_TestShell::
~TEST_MockCallTest_expectNoCallThatHappened_TestShell
          (TEST_MockCallTest_expectNoCallThatHappened_TestShell *this)

{
  TEST_MockCallTest_expectNoCallThatHappened_TestShell *this_local;
  
  ~TEST_MockCallTest_expectNoCallThatHappened_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallThatHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}